

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O3

bool __thiscall QJsonArray::contains(QJsonArray *this,QJsonValue *value)

{
  QCborContainerPrivate *pQVar1;
  ulong uVar2;
  bool bVar3;
  ulong i;
  ulong uVar4;
  long in_FS_OFFSET;
  QJsonValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  do {
    i = uVar2;
    pQVar1 = (this->a).d.ptr;
    if (pQVar1 == (QCborContainerPrivate *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (pQVar1->elements).d.size;
    }
    if (uVar4 <= i) break;
    at(&local_50,this,i);
    bVar3 = ::comparesEqual(&local_50,value);
    QJsonValue::~QJsonValue(&local_50);
    uVar2 = i + 1;
  } while (!bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return i < uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QJsonArray::contains(const QJsonValue &value) const
{
    for (qsizetype i = 0; i < size(); i++) {
        if (at(i) == value)
            return true;
    }
    return false;
}